

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

ExecutionReport *
anon_unknown.dwarf_334836::createExecutionReport
          (ExecutionReport *__return_storage_ptr__,char *sender,char *target,int seq)

{
  undefined1 *this;
  int iVar1;
  allocator<char> local_43e;
  CHAR local_43d [3];
  allocator<char> local_43a;
  allocator<char> local_439;
  FieldBase local_438;
  FieldBase local_3e0;
  NoContraBrokers noContraBrokers;
  PRICE local_310;
  QTY local_308;
  QTY local_300;
  STRING local_2f8;
  STRING local_2d8;
  STRING local_2b8;
  FieldBase local_298;
  FieldBase local_240;
  FieldBase local_1e8;
  FieldBase local_190;
  FieldBase local_138;
  FieldBase local_e0;
  FieldBase local_88;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"ID",&local_439);
  FIX::OrderID::OrderID((OrderID *)&noContraBrokers,&local_2b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"ID",&local_43a);
  FIX::ExecID::ExecID((ExecID *)&local_438,&local_2d8);
  local_43d[2] = 0x30;
  FIX::ExecTransType::ExecTransType((ExecTransType *)&local_3e0,local_43d + 2);
  local_43d[1] = 0x30;
  FIX::ExecType::ExecType((ExecType *)&local_298,local_43d + 1);
  local_43d[0] = '0';
  FIX::OrdStatus::OrdStatus((OrdStatus *)&local_240,local_43d);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"SYMBOL",&local_43e);
  FIX::Symbol::Symbol((Symbol *)&local_88,&local_2f8);
  FIX::Side::Side((Side *)&local_e0,"11D");
  local_300 = 100.0;
  FIX::LeavesQty::LeavesQty((LeavesQty *)&local_138,&local_300);
  local_308 = 0.0;
  FIX::CumQty::CumQty((CumQty *)&local_190,&local_308);
  local_310 = 0.0;
  FIX::AvgPx::AvgPx((AvgPx *)&local_1e8,&local_310);
  FIX42::ExecutionReport::ExecutionReport
            (__return_storage_ptr__,(OrderID *)&noContraBrokers,(ExecID *)&local_438,
             (ExecTransType *)&local_3e0,(ExecType *)&local_298,(OrdStatus *)&local_240,
             (Symbol *)&local_88,(Side *)&local_e0,(LeavesQty *)&local_138,(CumQty *)&local_190,
             (AvgPx *)&local_1e8);
  FIX::FieldBase::~FieldBase(&local_1e8);
  FIX::FieldBase::~FieldBase(&local_190);
  FIX::FieldBase::~FieldBase(&local_138);
  FIX::FieldBase::~FieldBase(&local_e0);
  FIX::FieldBase::~FieldBase(&local_88);
  std::__cxx11::string::~string((string *)&local_2f8);
  FIX::FieldBase::~FieldBase(&local_240);
  FIX::FieldBase::~FieldBase(&local_298);
  FIX::FieldBase::~FieldBase(&local_3e0);
  FIX::FieldBase::~FieldBase(&local_438);
  std::__cxx11::string::~string((string *)&local_2d8);
  FIX::FieldBase::~FieldBase((FieldBase *)&noContraBrokers);
  std::__cxx11::string::~string((string *)&local_2b8);
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,"ISLD","TW",2);
  FIX42::ExecutionReport::NoContraBrokers::NoContraBrokers(&noContraBrokers);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e0,"BROKER",(allocator<char> *)&local_298);
  FIX::ContraBroker::ContraBroker((ContraBroker *)&local_438,(STRING *)&local_3e0);
  FIX42::ExecutionReport::NoContraBrokers::set(&noContraBrokers,(ContraBroker *)&local_438);
  FIX::FieldBase::~FieldBase(&local_438);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e0,"TRADER",(allocator<char> *)&local_298);
  FIX::ContraTrader::ContraTrader((ContraTrader *)&local_438,(STRING *)&local_3e0);
  FIX42::ExecutionReport::NoContraBrokers::set(&noContraBrokers,(ContraTrader *)&local_438);
  FIX::FieldBase::~FieldBase(&local_438);
  std::__cxx11::string::~string((string *)&local_3e0);
  local_3e0._vptr_FieldBase = (_func_int **)0x4059000000000000;
  FIX::ContraTradeQty::ContraTradeQty((ContraTradeQty *)&local_438,(QTY *)&local_3e0);
  FIX42::ExecutionReport::NoContraBrokers::set(&noContraBrokers,(ContraTradeQty *)&local_438);
  FIX::FieldBase::~FieldBase(&local_438);
  FIX::ContraTradeTime::now();
  FIX42::ExecutionReport::NoContraBrokers::set(&noContraBrokers,(ContraTradeTime *)&local_438);
  FIX::FieldBase::~FieldBase(&local_438);
  FIX::Message::addGroup((Message *)__return_storage_ptr__,&noContraBrokers.super_Group);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e0,"BROKER2",(allocator<char> *)&local_298);
  FIX::ContraBroker::ContraBroker((ContraBroker *)&local_438,(STRING *)&local_3e0);
  FIX42::ExecutionReport::NoContraBrokers::set(&noContraBrokers,(ContraBroker *)&local_438);
  FIX::FieldBase::~FieldBase(&local_438);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e0,"TRADER2",(allocator<char> *)&local_298);
  FIX::ContraTrader::ContraTrader((ContraTrader *)&local_438,(STRING *)&local_3e0);
  FIX42::ExecutionReport::NoContraBrokers::set(&noContraBrokers,(ContraTrader *)&local_438);
  FIX::FieldBase::~FieldBase(&local_438);
  std::__cxx11::string::~string((string *)&local_3e0);
  local_3e0._vptr_FieldBase = (_func_int **)0x4059000000000000;
  FIX::ContraTradeQty::ContraTradeQty((ContraTradeQty *)&local_438,(QTY *)&local_3e0);
  FIX42::ExecutionReport::NoContraBrokers::set(&noContraBrokers,(ContraTradeQty *)&local_438);
  FIX::FieldBase::~FieldBase(&local_438);
  FIX::ContraTradeTime::now();
  FIX42::ExecutionReport::NoContraBrokers::set(&noContraBrokers,(ContraTradeTime *)&local_438);
  FIX::FieldBase::~FieldBase(&local_438);
  FIX::Message::addGroup((Message *)__return_storage_ptr__,&noContraBrokers.super_Group);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&local_438,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&local_438,true);
  FIX::FieldBase::~FieldBase(&local_438);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&local_438,iVar1);
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,&local_438,true);
  FIX::FieldBase::~FieldBase(&local_438);
  FIX::FieldMap::~FieldMap((FieldMap *)&noContraBrokers);
  return __return_storage_ptr__;
}

Assistant:

FIX42::ExecutionReport createExecutionReport(const char *sender, const char *target, int seq) {
  FIX42::ExecutionReport executionReport(
      OrderID("ID"),
      ExecID("ID"),
      ExecTransType('0'),
      ExecType('0'),
      OrdStatus('0'),
      Symbol("SYMBOL"),
      Side(Side_BUY),
      LeavesQty(100),
      CumQty(0),
      AvgPx(0));
  fillHeader(executionReport.getHeader(), sender, target, seq);
  FIX42::ExecutionReport::NoContraBrokers noContraBrokers;
  noContraBrokers.set(ContraBroker("BROKER"));
  noContraBrokers.set(ContraTrader("TRADER"));
  noContraBrokers.set(ContraTradeQty(100));
  noContraBrokers.set(ContraTradeTime::now());
  executionReport.addGroup(noContraBrokers);
  noContraBrokers.set(ContraBroker("BROKER2"));
  noContraBrokers.set(ContraTrader("TRADER2"));
  noContraBrokers.set(ContraTradeQty(100));
  noContraBrokers.set(ContraTradeTime::now());
  executionReport.addGroup(noContraBrokers);
  executionReport.getHeader().setField(BodyLength(executionReport.bodyLength()));
  executionReport.getTrailer().setField(CheckSum(executionReport.checkSum()));
  return executionReport;
}